

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<Fad<double>_>::AddKel
          (TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *elmat,
          TPZVec<long> *destinationindex)

{
  int iVar1;
  long *plVar2;
  Fad<double> *pFVar3;
  TPZVec<long> *in_RDX;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  Fad<double> prevval_1;
  Fad<double> prevval;
  int64_t jeq;
  int64_t ieq;
  int64_t jcoef;
  int64_t icoef;
  int64_t nelem;
  Fad<double> *in_stack_ffffffffffffff60;
  int64_t in_stack_ffffffffffffff70;
  int64_t in_stack_ffffffffffffff78;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffff80;
  Fad<double> *in_stack_ffffffffffffff88;
  Fad<double> *in_stack_ffffffffffffff90;
  undefined1 local_60 [32];
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  int64_t local_20;
  TPZVec<long> *local_18;
  
  local_18 = in_RDX;
  local_20 = TPZBaseMatrix::Rows(in_RSI);
  iVar1 = (**(code **)(*in_RDI + 0x80))();
  if (iVar1 == 0) {
    for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
      plVar2 = TPZVec<long>::operator[](local_18,local_28);
      local_38 = *plVar2;
      for (local_30 = 0; local_30 < local_20; local_30 = local_30 + 1) {
        plVar2 = TPZVec<long>::operator[](local_18,local_30);
        local_40 = *plVar2;
        (**(code **)(*in_RDI + 0x120))(&stack0xffffffffffffff70,in_RDI,local_38,local_40);
        pFVar3 = TPZFMatrix<Fad<double>_>::operator()
                           (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                            in_stack_ffffffffffffff70);
        Fad<double>::operator+=<double,_nullptr>
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        (**(code **)(*in_RDI + 0x118))
                  (in_RDI,local_38,local_40,&stack0xffffffffffffff70,in_R8,in_R9,pFVar3);
        Fad<double>::~Fad(in_stack_ffffffffffffff60);
      }
    }
  }
  else {
    for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
      plVar2 = TPZVec<long>::operator[](local_18,local_28);
      local_38 = *plVar2;
      for (local_30 = local_28; local_30 < local_20; local_30 = local_30 + 1) {
        plVar2 = TPZVec<long>::operator[](local_18,local_30);
        local_40 = *plVar2;
        (**(code **)(*in_RDI + 0x120))(local_60,in_RDI,local_38,local_40);
        pFVar3 = TPZFMatrix<Fad<double>_>::operator()
                           (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                            in_stack_ffffffffffffff70);
        Fad<double>::operator+=<double,_nullptr>
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        (**(code **)(*in_RDI + 0x118))(in_RDI,local_38,local_40,local_60);
        Fad<double>::~Fad(pFVar3);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = elmat.Rows();
  	int64_t icoef,jcoef,ieq,jeq;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				TVar prevval = GetVal(ieq,jeq);
				prevval += elmat(icoef,jcoef);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				TVar prevval = GetVal(ieq,jeq);
				prevval += elmat(icoef,jcoef);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}